

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O0

float __thiscall nv::FloatImage::sampleLinearRepeat(FloatImage *this,float x,float y,int c)

{
  ushort uVar1;
  ushort uVar2;
  uint x_00;
  uint y_00;
  uint x_01;
  uint y_01;
  float fVar3;
  float t;
  float fVar4;
  float f1_00;
  float f0;
  float f1_01;
  float i2;
  float i1;
  float f4;
  float f3;
  float f2;
  float f1;
  int iy1;
  int ix1;
  int iy0;
  int ix0;
  float fracY;
  float fracX;
  int h;
  int w;
  int c_local;
  float y_local;
  float x_local;
  FloatImage *this_local;
  
  uVar1 = this->m_width;
  uVar2 = this->m_height;
  fVar3 = anon_unknown.dwarf_46676e::frac(x * (float)uVar1);
  t = anon_unknown.dwarf_46676e::frac(y * (float)uVar2);
  fVar4 = anon_unknown.dwarf_46676e::frac(x);
  x_00 = anon_unknown.dwarf_46676e::ifloor(fVar4 * (float)uVar1);
  fVar4 = anon_unknown.dwarf_46676e::frac(y);
  y_00 = anon_unknown.dwarf_46676e::ifloor(fVar4 * (float)uVar2);
  fVar4 = anon_unknown.dwarf_46676e::frac(x + 1.0 / (float)uVar1);
  x_01 = anon_unknown.dwarf_46676e::ifloor(fVar4 * (float)uVar1);
  fVar4 = anon_unknown.dwarf_46676e::frac(y + 1.0 / (float)uVar2);
  y_01 = anon_unknown.dwarf_46676e::ifloor(fVar4 * (float)uVar2);
  fVar4 = pixel(this,x_00,y_00,c);
  f1_00 = pixel(this,x_01,y_00,c);
  f0 = pixel(this,x_00,y_01,c);
  f1_01 = pixel(this,x_01,y_01,c);
  fVar4 = lerp(fVar4,f1_00,fVar3);
  fVar3 = lerp(f0,f1_01,fVar3);
  fVar3 = lerp(fVar4,fVar3,t);
  return fVar3;
}

Assistant:

float FloatImage::sampleLinearRepeat(float x, float y, int c) const
{
	const int w = m_width;
	const int h = m_height;
	
	const float fracX = frac(x * w);
	const float fracY = frac(y * h);
	
	int ix0 = ifloor(frac(x) * w);
	int iy0 = ifloor(frac(y) * h);
	int ix1 = ifloor(frac(x + 1.0f/w) * w);
	int iy1 = ifloor(frac(y + 1.0f/h) * h);
	
	float f1 = pixel(ix0, iy0, c);
	float f2 = pixel(ix1, iy0, c);
	float f3 = pixel(ix0, iy1, c);
	float f4 = pixel(ix1, iy1, c);
	
	float i1 = lerp(f1, f2, fracX);
	float i2 = lerp(f3, f4, fracX);

	return lerp(i1, i2, fracY);
}